

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractListView<QImage>::setModel(AbstractListView<QImage> *this,ListModel<QImage> *m)

{
  AbstractScrollAreaPrivate *pAVar1;
  ConnectionType type;
  Connection local_48 [8];
  Connection local_40 [8];
  Connection local_38 [8];
  Connection local_30 [8];
  Connection local_28 [8];
  
  pAVar1 = (this->super_AbstractListViewBase).super_AbstractScrollArea.d.d;
  if (pAVar1[1].q != (AbstractScrollArea *)0x0) {
    QObject::disconnect((QObject *)pAVar1[1].q,(char *)0x0,(QObject *)this,(char *)0x0);
  }
  pAVar1[1].q = (AbstractScrollArea *)m;
  type = (ConnectionType)this;
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(int,int),void(QtMWidgets::AbstractListView<QImage>::*)(int,int)>
            ((Object *)local_28,(offset_in_AbstractListModel_to_subr)m,
             (Object *)AbstractListModel::dataChanged,0,type);
  QMetaObject::Connection::~Connection(local_28);
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(),void(QtMWidgets::AbstractListView<QImage>::*)()>
            ((Object *)local_30,(offset_in_AbstractListModel_to_subr)pAVar1[1].q,
             (Object *)AbstractListModel::modelReset,0,type);
  QMetaObject::Connection::~Connection(local_30);
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(int,int),void(QtMWidgets::AbstractListView<QImage>::*)(int,int)>
            ((Object *)local_38,(offset_in_AbstractListModel_to_subr)pAVar1[1].q,
             (Object *)AbstractListModel::rowsInserted,0,type);
  QMetaObject::Connection::~Connection(local_38);
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(int,int),void(QtMWidgets::AbstractListView<QImage>::*)(int,int)>
            ((Object *)local_40,(offset_in_AbstractListModel_to_subr)pAVar1[1].q,
             (Object *)AbstractListModel::rowsRemoved,0,type);
  QMetaObject::Connection::~Connection(local_40);
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(int,int,int),void(QtMWidgets::AbstractListView<QImage>::*)(int,int,int)>
            ((Object *)local_48,(offset_in_AbstractListModel_to_subr)pAVar1[1].q,
             (Object *)AbstractListModel::rowsMoved,0,type);
  QMetaObject::Connection::~Connection(local_48);
  return;
}

Assistant:

void setModel( ListModel< T > * m )
	{
		AbstractListViewPrivate< T > * d = d_func();

		if( d->model )
			disconnect( d->model, 0, this, 0 );

		d->model = m;

		connect( d->model, &ListModel< T >::dataChanged,
			this, &AbstractListView< T >::dataChanged );
		connect( d->model, &ListModel< T >::modelReset,
			this, &AbstractListView< T >::modelReset );
		connect( d->model, &ListModel< T >::rowsInserted,
			this, &AbstractListView< T >::rowsInserted );
		connect( d->model, &ListModel< T >::rowsRemoved,
			this, &AbstractListView< T >::rowsRemoved );
		connect( d->model, &ListModel< T >::rowsMoved,
			this, &AbstractListView< T >::rowsMoved );
	}